

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void rw::V3d::transformVectors(V3d *out,V3d *in,int32 n,Matrix *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  long lVar13;
  
  if (0 < n) {
    lVar13 = 0;
    do {
      fVar1 = *(float *)((long)&in->x + lVar13);
      fVar2 = *(float *)((long)&in->y + lVar13);
      fVar3 = *(float *)((long)&in->z + lVar13);
      fVar4 = (float)(m->up).z;
      fVar5 = (float)(m->right).z;
      fVar6 = (float)(m->at).z;
      uVar7 = (m->right).x;
      uVar10 = (m->right).y;
      uVar8 = (m->up).x;
      uVar11 = (m->up).y;
      uVar9 = (m->at).x;
      uVar12 = (m->at).y;
      *(ulong *)((long)&out->x + lVar13) =
           CONCAT44(fVar3 * (float)uVar12 + fVar1 * (float)uVar10 + (float)uVar11 * fVar2,
                    fVar3 * (float)uVar9 + fVar1 * (float)uVar7 + (float)uVar8 * fVar2);
      *(float *)((long)&out->z + lVar13) = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2;
      lVar13 = lVar13 + 0xc;
    } while ((ulong)(uint)n * 0xc != lVar13);
  }
  return;
}

Assistant:

void
V3d::transformVectors(V3d *out, const V3d *in, int32 n, const Matrix *m)
{
	int32 i;
	V3d tmp;
	for(i = 0; i < n; i++){
		tmp.x = in[i].x*m->right.x + in[i].y*m->up.x + in[i].z*m->at.x;
		tmp.y = in[i].x*m->right.y + in[i].y*m->up.y + in[i].z*m->at.y;
		tmp.z = in[i].x*m->right.z + in[i].y*m->up.z + in[i].z*m->at.z;
		out[i] = tmp;
	}
}